

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMask::ResetNconstr(ChLinkMask *this,int newnconstr)

{
  ChConstraintTwoBodies *pCVar1;
  size_t __new_size;
  long lVar2;
  
  if (this->nconstr != newnconstr) {
    if (0 < this->nconstr) {
      lVar2 = 0;
      do {
        pCVar1 = (this->constraints).
                 super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar2];
        if (pCVar1 != (ChConstraintTwoBodies *)0x0) {
          (**(code **)((long)(pCVar1->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint +
                      8))();
          (this->constraints).
          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar2] = (ChConstraintTwoBodies *)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->nconstr);
    }
    this->nconstr = newnconstr;
    __new_size = (size_t)newnconstr;
    std::vector<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>::
    resize(&this->constraints,__new_size);
    if (0 < this->nconstr) {
      lVar2 = 0;
      do {
        pCVar1 = (ChConstraintTwoBodies *)
                 ChConstraintTwoBodies::operator_new((ChConstraintTwoBodies *)0x120,__new_size);
        ChConstraintTwoBodies::ChConstraintTwoBodies(pCVar1);
        (this->constraints).
        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar2] = pCVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->nconstr);
    }
  }
  return;
}

Assistant:

void ChLinkMask::ResetNconstr(int newnconstr) {
    if (nconstr != newnconstr) {
        for (int i = 0; i < nconstr; i++)
            if (constraints[i]) {
                delete constraints[i];
                constraints[i] = nullptr;
            }

        nconstr = newnconstr;

        constraints.resize(nconstr);

        for (int i = 0; i < nconstr; i++) {
            constraints[i] = new ChConstraintTwoBodies;
        }
    }
}